

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O1

bool bellmanFord(Graph *G,int *s,WeightMap *weight,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *pred,
                vector<long,_std::allocator<long>_> *dist)

{
  int iVar1;
  pointer puVar2;
  pointer psVar3;
  pointer psVar4;
  type *ptVar5;
  ulong *puVar6;
  ulong *puVar7;
  Graph *pGVar8;
  bool bVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  type extraout_RDX;
  type tVar14;
  type extraout_RDX_00;
  type tVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  type *ptVar19;
  size_type sVar20;
  ulong uVar21;
  pointer psVar22;
  Vertex v;
  EdgeIterator ei;
  Vertex NIL;
  vector<bool,_std::allocator<bool>_> in_Q;
  vector<bool,_std::allocator<bool>_> reached_from_node_in_U;
  vector<bool,_std::allocator<bool>_> in_R;
  queue<int,_std::deque<int,_std::allocator<int>_>_> Q;
  EdgeIterator ei_end;
  Graph g;
  ulong local_2a0;
  undefined8 local_298;
  undefined1 uStack_290;
  undefined7 uStack_28f;
  undefined1 uStack_288;
  undefined7 uStack_287;
  char cStack_280;
  ulong *local_278;
  ulong local_270;
  ulong *local_268;
  ulong local_260;
  long local_258;
  unsigned_long local_250;
  vector<bool,_std::allocator<bool>_> local_248;
  int local_21c;
  vector<bool,_std::allocator<bool>_> local_218;
  vector<bool,_std::allocator<bool>_> local_1f0;
  _Deque_base<int,_std::allocator<int>_> local_1c8;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_170;
  ulong local_e0;
  size_type local_d8;
  WeightMap *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined1 uStack_b8;
  undefined8 uStack_b7;
  ulong *local_a8;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_78;
  allocator_type *local_40;
  undefined8 *local_38;
  
  uVar17 = (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar21 = uVar17 >> 5;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d0 = weight;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_1c8,0);
  iVar16 = (int)uVar21;
  sVar20 = (size_type)iVar16;
  local_170.first.vBegin.m_value = local_170.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_248,sVar20,(bool *)&local_170,(allocator_type *)&local_298);
  local_250 = 0xffffffffffffffff;
  if ((uVar17 & 0x1fffffffff) != 0) {
    puVar2 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      puVar2[uVar13] = uVar13;
      uVar13 = uVar13 + 1;
    } while (sVar20 + (sVar20 == 0) != uVar13);
  }
  iVar1 = *s;
  (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar1] = 0;
  if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_1c8,s);
  }
  else {
    *local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = iVar1;
    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  uVar11 = (ulong)*s;
  uVar17 = uVar11 + 0x3f;
  if (-1 < (long)uVar11) {
    uVar17 = uVar11;
  }
  local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [((long)uVar17 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p
       [((long)uVar17 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)*s & 0x3f);
  if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<int,std::allocator<int>> *)&local_1c8,&local_250);
  }
  else {
    *local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int)local_250;
    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  bVar9 = 0 < iVar16;
  local_d8 = sVar20;
  if (0 < iVar16) {
    iVar16 = 0;
    local_e0 = uVar21;
    do {
      while( true ) {
        local_21c = iVar16;
        iVar1 = *local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar17 = (ulong)iVar1;
        if (local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_1c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_1c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        uVar21 = local_e0;
        iVar16 = local_21c;
        if (local_250 == uVar17) break;
        uVar21 = uVar17 + 0x3f;
        if (-1 < (long)uVar17) {
          uVar21 = uVar17;
        }
        bVar10 = (byte)iVar1 & 0x3f;
        local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar21 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar21 >> 6) +
              ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
             (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
        psVar3 = (G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar22 = *(pointer *)
                   &psVar3[uVar17].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
        ;
        psVar4 = *(pointer *)
                  ((long)&psVar3[uVar17].super_StoredVertex.m_out_edges.
                          super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                  + 8);
        if (psVar22 != psVar4) {
          lVar18 = (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          do {
            local_2a0 = (psVar22->super_stored_edge<unsigned_long>).m_target;
            lVar12 = *(int *)((long)(psVar22->m_property)._M_t.
                                    super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>
                                    ._M_t + local_d0->tag) + lVar18;
            puVar2 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if (((puVar2[local_2a0] == local_2a0) && (local_2a0 != (long)*s)) ||
               (lVar12 < (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start[local_2a0])) {
              (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_start[local_2a0] = lVar12;
              puVar2[local_2a0] = uVar17;
              uVar21 = local_2a0 + 0x3f;
              if (-1 < (long)local_2a0) {
                uVar21 = local_2a0;
              }
              if ((local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar21 >> 6) +
                    ((ulong)((local_2a0 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (local_2a0 & 0x3f) & 1) == 0) {
                if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<int,std::allocator<int>>::_M_push_back_aux<unsigned_long&>
                            ((deque<int,std::allocator<int>> *)&local_1c8,&local_2a0);
                }
                else {
                  *local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int)local_2a0;
                  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                uVar21 = local_2a0 + 0x3f;
                if (-1 < (long)local_2a0) {
                  uVar21 = local_2a0;
                }
                local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [((long)uVar21 >> 6) +
                 ((ulong)((local_2a0 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                     local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar21 >> 6) +
                      ((ulong)((local_2a0 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                     1L << ((byte)local_2a0 & 0x3f);
              }
            }
            psVar22 = psVar22 + 1;
          } while (psVar22 != psVar4);
        }
        iVar16 = local_21c;
        if (!bVar9) goto LAB_001125e7;
      }
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00112caf;
      if (local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<unsigned_long_const&>
                  ((deque<int,std::allocator<int>> *)&local_1c8,&local_250);
      }
      else {
        *local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int)local_250;
        local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      iVar16 = iVar16 + 1;
      bVar9 = iVar16 < (int)uVar21;
    } while (iVar16 != (int)uVar21);
  }
LAB_001125e7:
  sVar20 = local_d8;
  if ((pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[*s] != (long)*s) {
LAB_00112caf:
    if (local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_1c8);
    return bVar9;
  }
  local_170.first.vBegin.m_value = local_170.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1f0,local_d8,(bool *)&local_170,(allocator_type *)&local_298);
  local_170.first.vBegin.m_value = local_170.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_218,sVar20,(bool *)&local_170,(allocator_type *)&local_298);
  tVar15 = (type)&local_170;
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_78,(no_property *)tVar15);
  uStack_288 = 0;
  uStack_287 = 0;
  cStack_280 = '\0';
  local_298 = 0;
  uStack_290 = 0;
  uStack_28f = 0;
  uStack_b8 = 0;
  uStack_b7 = 0;
  local_c8 = 0;
  local_c0 = 0;
  uStack_bf = 0;
  ptVar19 = (type *)(G->super_type).m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  ptVar5 = (type *)(G->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  local_170.first.vEnd.m_value = (long)ptVar5 - (long)ptVar19 >> 5;
  if (ptVar5 == ptVar19) {
    local_170.first.vCurr.m_value = 0;
    local_170.first.edges.super_type.m_initialized = false;
    tVar14 = extraout_RDX;
  }
  else {
    tVar14 = *ptVar19;
    tVar15 = ptVar19[1];
    if (tVar15 == tVar14) {
      ptVar19 = ptVar19 + 5;
      local_170.first.vCurr.m_value = 0;
      do {
        if (local_170.first.vEnd.m_value + -1 == local_170.first.vCurr.m_value) {
          local_170.first.edges.super_type.m_initialized = false;
          local_170.first.vCurr.m_value = local_170.first.vEnd.m_value;
          goto LAB_001126dc;
        }
        tVar14 = (type)((_Vector_impl_data *)(ptVar19 + -1))->_M_start;
        tVar15 = *ptVar19;
        ptVar19 = ptVar19 + 4;
        local_170.first.vCurr.m_value = local_170.first.vCurr.m_value + 1;
      } while (tVar15 == tVar14);
    }
    else {
      local_170.first.vCurr.m_value = 0;
    }
    local_170.first.edges.super_type.m_initialized = true;
  }
LAB_001126dc:
  local_170.first.vBegin.m_value = 0;
  if (local_170.first.edges.super_type.m_initialized) {
    local_170.first.edges.super_type.m_storage.dummy_.aligner_ = tVar14;
    local_170.first.edges.super_type.m_storage.dummy_._8_8_ = local_170.first.vCurr.m_value;
    local_170.first.edges.super_type.m_storage.dummy_._16_8_ = tVar15;
    local_170.first.edges.super_type.m_storage.dummy_._24_8_ = local_170.first.vCurr.m_value;
  }
  local_170.second.vBegin.m_value = 0;
  local_170.second.edges.super_type.m_initialized = false;
  local_170.first.m_g = G;
  local_170.second.vCurr.m_value = local_170.first.vEnd.m_value;
  local_170.second.vEnd.m_value = local_170.first.vEnd.m_value;
  local_170.second.m_g = G;
  local_40 = (allocator_type *)&local_298;
  local_38 = &local_c8;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_170);
  if (local_170.second.edges.super_type.m_initialized == true) {
    local_170.second.edges.super_type.m_initialized = false;
  }
  if (local_170.first.edges.super_type.m_initialized == true) {
    local_170.first.edges.super_type.m_initialized = false;
  }
LAB_001127a9:
  uVar17 = local_270;
  if (CONCAT71(uStack_28f,uStack_290) == CONCAT71(uStack_bf,local_c0)) {
    if (CONCAT71(uStack_28f,uStack_290) != CONCAT71(uStack_287,uStack_288)) {
      if ((cStack_280 == '\0') || (uStack_b7._7_1_ == '\0')) goto LAB_00112d19;
      if (local_278 != local_a8) goto LAB_001127ef;
    }
    dfs(&local_78,s,&local_1f0);
    ptVar19 = (type *)(G->super_type).m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    ptVar5 = (type *)(G->super_type).m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
    local_170.first.vEnd.m_value = (long)ptVar5 - (long)ptVar19 >> 5;
    local_40 = (allocator_type *)&local_298;
    if (ptVar5 == ptVar19) {
      local_170.first.vCurr.m_value = 0;
      local_170.first.edges.super_type.m_initialized = false;
      tVar15 = extraout_RDX_00;
      goto LAB_00112996;
    }
    tVar15 = *ptVar19;
    s = *(int **)(ptVar19 + 1);
    if ((type)s != tVar15) {
      local_170.first.vCurr.m_value = 0;
      goto LAB_0011298c;
    }
    ptVar19 = ptVar19 + 5;
    local_170.first.vCurr.m_value = 0;
    goto LAB_00112974;
  }
LAB_001127ef:
  if (cStack_280 == '\0') goto LAB_00112d19;
  uVar21 = *local_278;
  if (local_270 ==
      (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar21]) {
    uVar11 = uVar21;
    if (uVar21 < local_270) {
      uVar11 = local_270;
    }
    if ((ulong)((long)local_78.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_78.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::resize(&local_78.super_type.m_vertices,uVar11 + 1);
    }
    psVar3 = local_78.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_170.first.vBegin.m_value = uVar21;
    local_170.first.vCurr.m_value = (value_type)operator_new(4);
    std::
    vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
    ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
              ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                *)(psVar3 + uVar17),
               (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_170);
    if ((void *)local_170.first.vCurr.m_value != (void *)0x0) {
      operator_delete((void *)local_170.first.vCurr.m_value,4);
    }
  }
  if (cStack_280 != '\0') {
    local_278 = local_278 + 2;
    if (local_278 == local_268) {
      uVar17 = CONCAT71(uStack_28f,uStack_290);
      lVar18 = uVar17 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_287,uStack_288) - 1U == uVar17) {
          uStack_290 = uStack_288;
          uStack_28f = uStack_287;
          goto LAB_001127a9;
        }
        puVar6 = *(ulong **)(*(long *)(local_258 + 0x18) + -8 + lVar18);
        puVar7 = *(ulong **)(*(long *)(local_258 + 0x18) + lVar18);
        lVar18 = lVar18 + 0x20;
        uVar17 = uVar17 + 1;
      } while (puVar7 == puVar6);
      uStack_290 = (undefined1)uVar17;
      uStack_28f = (undefined7)(uVar17 >> 8);
      local_278 = puVar6;
      local_270 = uVar17;
      local_268 = puVar7;
      local_260 = uVar17;
    }
    goto LAB_001127a9;
  }
  goto LAB_00112d38;
  while( true ) {
    tVar15 = (type)((_Vector_impl_data *)(ptVar19 + -1))->_M_start;
    s = *(int **)ptVar19;
    ptVar19 = ptVar19 + 4;
    local_170.first.vCurr.m_value = local_170.first.vCurr.m_value + 1;
    if ((type)s != tVar15) break;
LAB_00112974:
    if (local_170.first.vEnd.m_value + -1 == local_170.first.vCurr.m_value) {
      local_170.first.edges.super_type.m_initialized = false;
      local_170.first.vCurr.m_value = local_170.first.vEnd.m_value;
      goto LAB_00112996;
    }
  }
LAB_0011298c:
  local_170.first.edges.super_type.m_initialized = true;
LAB_00112996:
  local_170.first.vBegin.m_value = 0;
  if (local_170.first.edges.super_type.m_initialized) {
    local_170.first.edges.super_type.m_storage.dummy_.aligner_ = tVar15;
    local_170.first.edges.super_type.m_storage.dummy_._8_8_ = local_170.first.vCurr.m_value;
    local_170.first.edges.super_type.m_storage.dummy_._16_8_ = s;
    local_170.first.edges.super_type.m_storage.dummy_._24_8_ = local_170.first.vCurr.m_value;
  }
  local_170.second.vBegin.m_value = 0;
  local_170.second.edges.super_type.m_initialized = false;
  local_170.first.m_g = G;
  local_170.second.vCurr.m_value = local_170.first.vEnd.m_value;
  local_170.second.vEnd.m_value = local_170.first.vEnd.m_value;
  local_170.second.m_g = G;
  local_38 = &local_c8;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_170);
  if (local_170.second.edges.super_type.m_initialized == true) {
    local_170.second.edges.super_type.m_initialized = false;
  }
  if (local_170.first.edges.super_type.m_initialized == true) {
    local_170.first.edges.super_type.m_initialized = false;
  }
LAB_00112a71:
  if (CONCAT71(uStack_28f,uStack_290) == CONCAT71(uStack_bf,local_c0)) {
    if (CONCAT71(uStack_28f,uStack_290) != CONCAT71(uStack_287,uStack_288)) {
      if ((cStack_280 == '\0') || (uStack_b7._7_1_ == '\0')) {
LAB_00112d19:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_278 != local_a8) goto LAB_00112ab7;
    }
    if (uStack_b7._7_1_ == '\x01') {
      uStack_b7 = uStack_b7 & 0xffffffffffffff;
    }
    if (cStack_280 == '\x01') {
      cStack_280 = '\0';
    }
    if (local_78.m_property.px != (no_property *)0x0) {
      operator_delete(local_78.m_property.px,1);
    }
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::~vector(&local_78.super_type.m_vertices);
    while ((Graph *)local_78.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next != &local_78) {
      pGVar8 = (Graph *)(((Graph *)
                         local_78.super_type.m_edges.
                         super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
      operator_delete(local_78.super_type.m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0x28);
      local_78.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar8;
    }
    if (local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    goto LAB_00112caf;
  }
LAB_00112ab7:
  uVar17 = local_2a0 + 0x3f;
  if (-1 < (long)local_2a0) {
    uVar17 = local_2a0;
  }
  uVar21 = (ulong)((local_2a0 & 0x800000000000003f) < 0x8000000000000001);
  if (((local_248.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar17 >> 6) + (uVar21 - 1)] >>
        (local_2a0 & 0x3f) & 1) != 0) &&
     ((local_218.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p[((long)uVar17 >> 6) + (uVar21 - 1)] &
      1L << ((byte)local_2a0 & 0x3f)) == 0)) {
    local_170.first.vBegin.m_value._0_4_ = (int)local_2a0;
    updatePred(G,(int *)&local_170,&local_1f0,&local_218,pred);
  }
  if (cStack_280 != '\0') {
    local_278 = local_278 + 2;
    if (local_278 == local_268) {
      uVar17 = CONCAT71(uStack_28f,uStack_290);
      lVar18 = uVar17 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_287,uStack_288) - 1U == uVar17) {
          uStack_290 = uStack_288;
          uStack_28f = uStack_287;
          goto LAB_00112a71;
        }
        puVar6 = *(ulong **)(*(long *)(local_258 + 0x18) + -8 + lVar18);
        puVar7 = *(ulong **)(*(long *)(local_258 + 0x18) + lVar18);
        lVar18 = lVar18 + 0x20;
        uVar17 = uVar17 + 1;
      } while (puVar7 == puVar6);
      uStack_290 = (undefined1)uVar17;
      uStack_28f = (undefined7)(uVar17 >> 8);
      local_278 = puVar6;
      local_270 = uVar17;
      local_268 = puVar7;
      local_260 = uVar17;
    }
    goto LAB_00112a71;
  }
LAB_00112d38:
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
               );
}

Assistant:

bool bellmanFord(const Graph& G, const int& s, const WeightMap& weight, 
    std::vector<unsigned long>& pred, std::vector<long>& dist)
{ 
    // init
    int N = num_vertices(G);
    int phase_count = 0;
    std::queue<int> Q;
    std::vector<bool> in_Q(N, false);
    const Vertex NIL =  boost::graph_traits<Graph>::null_vertex(); // end marker
    for (unsigned long i = 0; i < N; ++i) pred[i] = i;

    dist[s] = 0;
    Q.emplace(s); 
    in_Q[s] = true;
    Q.emplace(NIL);

    // basic step
    Vertex v, u;
    OutEdgeIterator oei, oei_end;
    while(phase_count < N) {
        u = Q.front(); Q.pop();
        if ( u == NIL) { 
            phase_count++;
            if (Q.empty()) return true;
            Q.emplace(NIL);
            continue;
        } else {
            in_Q[u] = false;
        }

        long du = dist[u];
        for(boost::tie(oei, oei_end) = out_edges(u, G); oei != oei_end; ++oei) {
            v = target(*oei,G);
            long d = du + weight[*oei];
            if ( (pred[v] == v && v != s) || d < dist[v] ) { 
                dist[v] = d; 
                pred[v] = u;
                if ( !in_Q[v] ) { 
                    Q.emplace(v); 
                    in_Q[v] = true; 
                }
            }
        }   
    }

    // postprocessing
    if (pred[s] != s) return false;

    // postprocessing init
    std::vector<bool> in_R(N, false);
    std::vector<bool> reached_from_node_in_U(N,false);

    // Creating a subgraph with all adges in shortest path
    Graph g;
    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = edges(G); ei != ei_end; ++ei) {
        if (source(*ei,G) == pred[target(*ei,G)] ) {
            add_edge(source(*ei,G), target(*ei,G), g);
        }
    }
    // reachable by s -> in_R
    dfs(g, s, in_R);

    // update predecessors.
    for(boost::tie(ei, ei_end) = edges(G); ei != ei_end; ++ei) {
        if (in_Q[v] && !reached_from_node_in_U[v]) {
            updatePred(G, v, in_R, reached_from_node_in_U, pred);
        }
    }
    
    return false;
}